

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O1

void __thiscall EnrichableI2cAnalyzer::AdvanceToStartBit(EnrichableI2cAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  EnrichableI2cAnalyzerResults *pEVar2;
  int iVar3;
  MarkerType MVar4;
  
  do {
    do {
      AnalyzerChannelData::AdvanceToNextEdge();
      iVar3 = AnalyzerChannelData::GetBitState();
    } while (iVar3 != 0);
    pAVar1 = this->mScl;
    AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)pAVar1);
    iVar3 = AnalyzerChannelData::GetBitState();
  } while (iVar3 != 1);
  pEVar2 = (this->mResults)._M_ptr;
  MVar4 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerResults::AddMarker((ulonglong)pEVar2,MVar4,(Channel *)0x8);
  return;
}

Assistant:

void EnrichableI2cAnalyzer::AdvanceToStartBit()
{
	for( ; ; )
	{
		mSda->AdvanceToNextEdge();

		if( mSda->GetBitState() == BIT_LOW )
		{
			//SDA negedge
			mScl->AdvanceToAbsPosition( mSda->GetSampleNumber() );
			if( mScl->GetBitState() == BIT_HIGH )
				break;
		}
	}
	mResults->AddMarker( mSda->GetSampleNumber(), AnalyzerResults::Start, mSettings->mSdaChannel );
}